

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

bool ImNodes::Connection(void *input_node,char *input_slot,void *output_node,char *output_slot)

{
  ImGuiStorage *this;
  float *pfVar1;
  bool bVar2;
  ImU32 IVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  undefined1 local_90 [8];
  _IgnoreSlot ignore_connection;
  char *pcStack_70;
  int pending_slot_kind;
  char *pending_slot_title;
  void *pending_node_id;
  float fStack_58;
  bool curve_hovered;
  float connection_indent;
  ImVec2 output_slot_pos;
  ImVec2 input_slot_pos;
  _CanvasStateImpl *impl;
  CanvasState *canvas;
  bool is_connected;
  char *output_slot_local;
  void *output_node_local;
  char *input_slot_local;
  void *input_node_local;
  
  pfVar1 = gCanvas;
  if (gCanvas == (float *)0x0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,600,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (input_node == (void *)0x0) {
    __assert_fail("input_node != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x259,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (input_slot == (char *)0x0) {
    __assert_fail("input_slot != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x25a,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (output_node != (void *)0x0) {
    if (output_slot != (char *)0x0) {
      input_node_local._7_1_ = true;
      this = *(ImGuiStorage **)(gCanvas + 0x26);
      if (((Pair *)input_node == this[3].Data.Data) || ((Pair *)output_node == this[3].Data.Data)) {
        input_node_local._7_1_ = true;
      }
      else {
        IVar3 = MakeSlotDataID("x",input_slot,input_node,true);
        fVar5 = ImGuiStorage::GetFloat(this,IVar3,0.0);
        IVar3 = MakeSlotDataID("y",input_slot,input_node,true);
        fVar6 = ImGuiStorage::GetFloat(this,IVar3,0.0);
        ImVec2::ImVec2(&output_slot_pos,fVar5,fVar6);
        IVar3 = MakeSlotDataID("x",output_slot,output_node,false);
        fVar5 = ImGuiStorage::GetFloat(this,IVar3,0.0);
        IVar3 = MakeSlotDataID("y",output_slot,output_node,false);
        fVar6 = ImGuiStorage::GetFloat(this,IVar3,0.0);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa8,fVar5,fVar6);
        pending_node_id._4_4_ = pfVar1[0x24] * *pfVar1;
        output_slot_pos.x = pending_node_id._4_4_ + output_slot_pos.x;
        fStack_58 = fStack_58 - pending_node_id._4_4_;
        pending_node_id._3_1_ =
             RenderConnection(&output_slot_pos,(ImVec2 *)&stack0xffffffffffffffa8,pfVar1[0x23]);
        if (((bool)pending_node_id._3_1_) && (bVar2 = ImGui::IsWindowHovered(0), bVar2)) {
          bVar2 = ImGui::IsMouseDoubleClicked(0);
          canvas._7_1_ = !bVar2;
          input_node_local._7_1_ = canvas._7_1_;
        }
        IVar3 = MakeSlotDataID("hovered",input_slot,input_node,true);
        bVar2 = false;
        if ((pending_node_id._3_1_ & 1) != 0) {
          bVar2 = input_node_local._7_1_;
        }
        ImGuiStorage::SetFloat(this,IVar3,(float)bVar2);
        IVar3 = MakeSlotDataID("hovered",output_slot,output_node,false);
        bVar2 = false;
        if ((pending_node_id._3_1_ & 1) != 0) {
          bVar2 = input_node_local._7_1_;
        }
        ImGuiStorage::SetFloat(this,IVar3,(float)bVar2);
        bVar2 = GetPendingConnection
                          (&pending_slot_title,&stack0xffffffffffffff90,
                           (int *)&ignore_connection.field_0x14);
        if (bVar2) {
          memset(local_90,0,0x18);
          _IgnoreSlot::_IgnoreSlot((_IgnoreSlot *)local_90);
          bVar2 = IsInputSlotKind(ignore_connection._20_4_);
          if (bVar2) {
            if ((pending_slot_title == (char *)input_node) &&
               (iVar4 = strcmp(pcStack_70,input_slot), iVar4 == 0)) {
              local_90 = (undefined1  [8])output_node;
              ignore_connection.node_id = output_slot;
              ignore_connection.slot_name._0_4_ = OutputSlotKind(1);
            }
          }
          else if ((pending_slot_title == (char *)output_node) &&
                  (iVar4 = strcmp(pcStack_70,output_slot), iVar4 == 0)) {
            local_90 = (undefined1  [8])input_node;
            ignore_connection.node_id = input_slot;
            ignore_connection.slot_name._0_4_ = InputSlotKind(1);
          }
          if ((local_90 != (undefined1  [8])0x0) &&
             (bVar2 = ImVector<ImNodes::_IgnoreSlot>::contains
                                ((ImVector<ImNodes::_IgnoreSlot> *)&this[9].Data.Data,
                                 (_IgnoreSlot *)local_90), !bVar2)) {
            ImVector<ImNodes::_IgnoreSlot>::push_back
                      ((ImVector<ImNodes::_IgnoreSlot> *)&this[9].Data.Data,(_IgnoreSlot *)local_90)
            ;
          }
        }
      }
      return input_node_local._7_1_;
    }
    __assert_fail("output_slot != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x25c,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  __assert_fail("output_node != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                ,0x25b,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
}

Assistant:

bool Connection(void* input_node, const char* input_slot, void* output_node, const char* output_slot)
{
    assert(gCanvas != nullptr);
    assert(input_node != nullptr);
    assert(input_slot != nullptr);
    assert(output_node != nullptr);
    assert(output_slot != nullptr);

    bool is_connected = true;
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    if (input_node == impl->auto_position_node_id || output_node == impl->auto_position_node_id)
        // Do not render connection to newly added output node because node is rendered outside of screen on the first frame and will be repositioned.
        return is_connected;

    ImVec2 input_slot_pos{
        impl->cached_data.GetFloat(MakeSlotDataID("x", input_slot, input_node, true)),
        impl->cached_data.GetFloat(MakeSlotDataID("y", input_slot, input_node, true)),
    };

    ImVec2 output_slot_pos{
        impl->cached_data.GetFloat(MakeSlotDataID("x", output_slot, output_node, false)),
        impl->cached_data.GetFloat(MakeSlotDataID("y", output_slot, output_node, false)),
    };

    // Indent connection a bit into slot widget.
    float connection_indent = canvas->style.connection_indent * canvas->zoom;
    input_slot_pos.x += connection_indent;
    output_slot_pos.x -= connection_indent;

    bool curve_hovered = RenderConnection(input_slot_pos, output_slot_pos, canvas->style.curve_thickness);
    if (curve_hovered && ImGui::IsWindowHovered())
    {
        if (ImGui::IsMouseDoubleClicked(0))
            is_connected = false;
    }

    impl->cached_data.SetFloat(MakeSlotDataID("hovered", input_slot, input_node, true), curve_hovered && is_connected);
    impl->cached_data.SetFloat(MakeSlotDataID("hovered", output_slot, output_node, false), curve_hovered && is_connected);

    void* pending_node_id;
    const char* pending_slot_title;
    int pending_slot_kind;
    if (GetPendingConnection(&pending_node_id, &pending_slot_title, &pending_slot_kind))
    {
        _IgnoreSlot ignore_connection{};
        if (IsInputSlotKind(pending_slot_kind))
        {
            if (pending_node_id == input_node && strcmp(pending_slot_title, input_slot) == 0)
            {
                ignore_connection.node_id = output_node;
                ignore_connection.slot_name = output_slot;
                ignore_connection.slot_kind = OutputSlotKind(1);
            }
        }
        else
        {
            if (pending_node_id == output_node && strcmp(pending_slot_title, output_slot) == 0)
            {
                ignore_connection.node_id = input_node;
                ignore_connection.slot_name = input_slot;
                ignore_connection.slot_kind = InputSlotKind(1);
            }
        }
        if (ignore_connection.node_id)
        {
            if (!impl->ignore_connections.contains(ignore_connection))
                impl->ignore_connections.push_back(ignore_connection);
        }
    }

    return is_connected;
}